

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O3

void gnilk::Logger::DisableAllLoggers(void)

{
  LogManager *pLVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  pLVar1 = LogManager::Instance();
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_std::shared_ptr<gnilk::Log>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:62:40)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::shared_ptr<gnilk::Log>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:62:40)>
             ::_M_manager;
  LogManager::IterateLogs(pLVar1,(LogDelegate *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  pLVar1 = LogManager::Instance();
  pLVar1->enableLogOnCreate = false;
  return;
}

Assistant:

void Logger::DisableAllLoggers() {
    LogManager::Instance().IterateLogs([](const Log::Ref &log) {
        log->SetEnabled(false);
        return true;
    });
    LogManager::Instance().SetEnableLogOnCreate(false);
}